

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O1

int mbedtls_ctr_drbg_reseed_internal
              (mbedtls_ctr_drbg_context *ctx,uchar *additional,size_t len,size_t nonce_len)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  size_t data_len;
  uchar local_1b8 [8];
  uchar seed [384];
  
  uVar1 = ctx->entropy_len;
  iVar3 = -0x38;
  if ((uVar1 < 0x181) && (len <= (0x180 - uVar1) - nonce_len && nonce_len <= 0x180 - uVar1)) {
    seed._376_8_ = additional;
    memset(local_1b8,0,0x180);
    iVar2 = (*ctx->f_entropy)(ctx->p_entropy,local_1b8,uVar1);
    iVar3 = -0x34;
    if (iVar2 == 0) {
      data_len = ctx->entropy_len;
      if (nonce_len != 0) {
        iVar3 = (*ctx->f_entropy)(ctx->p_entropy,local_1b8 + data_len,nonce_len);
        if (iVar3 != 0) {
          return -0x34;
        }
        data_len = data_len + nonce_len;
      }
      if (len != 0 && seed._376_8_ != 0) {
        memcpy(local_1b8 + data_len,(void *)seed._376_8_,len);
        data_len = data_len + len;
      }
      iVar3 = block_cipher_df(local_1b8,local_1b8,data_len);
      if ((iVar3 == 0) && (iVar3 = ctr_drbg_update_internal(ctx,local_1b8), iVar3 == 0)) {
        ctx->reseed_counter = 1;
        iVar3 = 0;
      }
      mbedtls_platform_zeroize(local_1b8,0x180);
    }
  }
  return iVar3;
}

Assistant:

static int mbedtls_ctr_drbg_reseed_internal(mbedtls_ctr_drbg_context *ctx,
                                            const unsigned char *additional,
                                            size_t len,
                                            size_t nonce_len)
{
    unsigned char seed[MBEDTLS_CTR_DRBG_MAX_SEED_INPUT];
    size_t seedlen = 0;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    if (ctx->entropy_len > MBEDTLS_CTR_DRBG_MAX_SEED_INPUT) {
        return MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG;
    }
    if (nonce_len > MBEDTLS_CTR_DRBG_MAX_SEED_INPUT - ctx->entropy_len) {
        return MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG;
    }
    if (len > MBEDTLS_CTR_DRBG_MAX_SEED_INPUT - ctx->entropy_len - nonce_len) {
        return MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG;
    }

    memset(seed, 0, MBEDTLS_CTR_DRBG_MAX_SEED_INPUT);

    /* Gather entropy_len bytes of entropy to seed state. */
    if (0 != ctx->f_entropy(ctx->p_entropy, seed, ctx->entropy_len)) {
        return MBEDTLS_ERR_CTR_DRBG_ENTROPY_SOURCE_FAILED;
    }
    seedlen += ctx->entropy_len;

    /* Gather entropy for a nonce if requested. */
    if (nonce_len != 0) {
        if (0 != ctx->f_entropy(ctx->p_entropy, seed + seedlen, nonce_len)) {
            return MBEDTLS_ERR_CTR_DRBG_ENTROPY_SOURCE_FAILED;
        }
        seedlen += nonce_len;
    }

    /* Add additional data if provided. */
    if (additional != NULL && len != 0) {
        memcpy(seed + seedlen, additional, len);
        seedlen += len;
    }

    /* Reduce to 384 bits. */
    if ((ret = block_cipher_df(seed, seed, seedlen)) != 0) {
        goto exit;
    }

    /* Update state. */
    if ((ret = ctr_drbg_update_internal(ctx, seed)) != 0) {
        goto exit;
    }
    ctx->reseed_counter = 1;

exit:
    mbedtls_platform_zeroize(seed, sizeof(seed));
    return ret;
}